

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O1

bool S_CheckSound(sfxinfo_t *startsfx,sfxinfo_t *sfx,TArray<sfxinfo_t_*,_sfxinfo_t_*> *chain)

{
  uint amount;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  sfxinfo_t *sfx_00;
  ulong uVar5;
  FRandomSoundList *pFVar6;
  ulong uVar7;
  
  if ((sfx->field_0x30 & 2) != 0) {
    return true;
  }
  amount = chain->Count;
  uVar5 = (ulong)amount;
  if (uVar5 == 0) {
    uVar7 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar7 = uVar4;
      if (chain->Array[uVar4] == sfx) break;
      uVar4 = uVar4 + 1;
      uVar7 = uVar5;
    } while (uVar5 != uVar4);
  }
  if ((uint)uVar7 < amount) {
    return true;
  }
  TArray<sfxinfo_t_*,_sfxinfo_t_*>::Grow(chain,1);
  uVar1 = chain->Count;
  chain->Array[uVar1] = sfx;
  chain->Count = uVar1 + 1;
  uVar1 = sfx->link;
  if ((sfx->field_0x30 & 1) == 0) {
    if (uVar1 != 0xffffffff) {
      if (S_sfx.Array + uVar1 == startsfx) {
        Printf("\x1cGrecursive sound $alias found for %s:\n",(startsfx->name).Chars);
        if (1 < chain->Count) {
          uVar5 = 1;
          do {
            Printf("\x1cI    -> %s\n",(chain->Array[uVar5]->name).Chars);
            uVar5 = uVar5 + 1;
          } while (uVar5 < chain->Count);
        }
        TArray<sfxinfo_t_*,_sfxinfo_t_*>::Resize(chain,amount);
        bVar2 = false;
      }
      else {
        bVar2 = S_CheckSound(startsfx,S_sfx.Array + uVar1,chain);
      }
      goto LAB_002f278f;
    }
  }
  else if (S_rnd.Array[uVar1].NumSounds != 0) {
    pFVar6 = S_rnd.Array + uVar1;
    bVar2 = true;
    uVar5 = 0;
    do {
      sfx_00 = (sfxinfo_t *)
               ((long)&((S_sfx.Array)->data).data + (ulong)((uint)pFVar6->Sounds[uVar5] * 0x50));
      if (sfx_00 == startsfx) {
        bVar2 = false;
        Printf("\x1cGrecursive sound $random found for %s:\n",(startsfx->name).Chars);
        if (1 < chain->Count) {
          uVar7 = 1;
          do {
            bVar2 = false;
            Printf("\x1cI    -> %s\n",(chain->Array[uVar7]->name).Chars);
            uVar7 = uVar7 + 1;
          } while (uVar7 < chain->Count);
        }
      }
      else {
        bVar3 = S_CheckSound(startsfx,sfx_00,chain);
        bVar2 = bVar2 != false && bVar3;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < pFVar6->NumSounds);
    goto LAB_002f278f;
  }
  bVar2 = true;
LAB_002f278f:
  if (chain->Count != 0) {
    chain->Count = chain->Count - 1;
  }
  return bVar2;
}

Assistant:

static bool S_CheckSound(sfxinfo_t *startsfx, sfxinfo_t *sfx, TArray<sfxinfo_t *> &chain)
{
	sfxinfo_t *me = sfx;
	bool success = true;
	unsigned siz = chain.Size();

	if (sfx->bPlayerReserve)
	{
		return true;
	}

	// There is a bad link in here, but let's report it only for the sound that contains the broken definition.
	// Once that sound has been disabled this one will work again.
	if (chain.Find(sfx) < chain.Size())
	{
		return true;
	}
	chain.Push(sfx);

	if (me->bRandomHeader)
	{
		const FRandomSoundList *list = &S_rnd[me->link];
		for (int i = 0; i < list->NumSounds; ++i)
		{
			auto rsfx = &S_sfx[list->Sounds[i]];
			if (rsfx == startsfx)
			{
				Printf(TEXTCOLOR_RED "recursive sound $random found for %s:\n", startsfx->name.GetChars());
				success = false;
				for (unsigned i = 1; i<chain.Size(); i++)
				{
					Printf(TEXTCOLOR_ORANGE "    -> %s\n", chain[i]->name.GetChars());
				}
			}
			else
			{
				success &= S_CheckSound(startsfx, rsfx, chain);
			}
		}
	}
	else if (me->link != sfxinfo_t::NO_LINK)
	{
		me = &S_sfx[me->link];
		if (me == startsfx)
		{
			Printf(TEXTCOLOR_RED "recursive sound $alias found for %s:\n", startsfx->name.GetChars());
			success = false;
			for (unsigned i = 1; i<chain.Size(); i++)
			{
				Printf(TEXTCOLOR_ORANGE "    -> %s\n", chain[i]->name.GetChars());
			}
			chain.Resize(siz);
		}
		else
		{
			success &= S_CheckSound(startsfx, me, chain);
		}
	}
	chain.Pop();
	return success;
}